

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void Json::decodePrefixedString(bool isPrefixed,char *prefixed,uint *length,char **value)

{
  size_t sVar1;
  char **value_local;
  uint *length_local;
  char *prefixed_local;
  bool isPrefixed_local;
  
  if (isPrefixed) {
    *length = *(uint *)prefixed;
    *value = prefixed + 4;
  }
  else {
    sVar1 = strlen(prefixed);
    *length = (uint)sVar1;
    *value = prefixed;
  }
  return;
}

Assistant:

inline static void decodePrefixedString(bool isPrefixed, char const* prefixed,
                                        unsigned* length, char const** value) {
  if (!isPrefixed) {
    *length = static_cast<unsigned>(strlen(prefixed));
    *value = prefixed;
  } else {
    *length = *reinterpret_cast<unsigned const*>(prefixed);
    *value = prefixed + sizeof(unsigned);
  }
}